

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_Error tt_cmap4_validate(FT_Byte *table,FT_Validator valid)

{
  FT_Byte FVar1;
  byte bVar2;
  FT_Byte FVar3;
  FT_Byte FVar4;
  FT_Byte FVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  FT_Byte *pFVar11;
  uint local_a4;
  FT_UInt idx;
  FT_UInt i;
  FT_Byte *p_offset;
  FT_Byte *p_delta;
  FT_Byte *p_end;
  FT_Byte *p_start;
  FT_Int delta;
  FT_UInt last_end;
  FT_UInt last_start;
  FT_UInt n;
  FT_UInt offset;
  FT_UInt end;
  FT_UInt start;
  FT_UInt range_shift;
  FT_UInt entry_selector;
  FT_UInt search_range;
  FT_Error error;
  FT_UInt num_segs;
  FT_Byte *glyph_ids;
  FT_Byte *deltas;
  FT_Byte *offsets;
  FT_Byte *starts;
  FT_Byte *ends;
  FT_Byte *pFStack_20;
  FT_UInt length;
  FT_Byte *p;
  FT_Validator valid_local;
  FT_Byte *table_local;
  
  entry_selector = 0;
  if (valid->limit < table + 4) {
    ft_validator_error(valid,8);
  }
  ends._4_4_ = (uint)CONCAT11(table[2],table[3]);
  if (valid->limit < table + ends._4_4_) {
    if (valid->level != FT_VALIDATE_DEFAULT) {
      ft_validator_error(valid,8);
    }
    ends._4_4_ = (int)valid->limit - (int)table;
  }
  if (ends._4_4_ < 0x10) {
    ft_validator_error(valid,8);
  }
  FVar1 = table[6];
  bVar2 = table[7];
  if ((FT_VALIDATE_TIGHT < valid->level) && ((bVar2 & 1) != 0)) {
    ft_validator_error(valid,8);
  }
  uVar6 = CONCAT11(FVar1,bVar2) >> 1;
  uVar7 = (uint)uVar6;
  if (ends._4_4_ < uVar7 * 8 + 0x10) {
    ft_validator_error(valid,8);
  }
  if (FT_VALIDATE_TIGHT < valid->level) {
    FVar1 = table[8];
    FVar3 = table[9];
    bVar2 = table[0xb];
    FVar4 = table[0xc];
    FVar5 = table[0xd];
    if (((CONCAT11(FVar1,FVar3) | CONCAT11(FVar4,FVar5)) & 1) != 0) {
      ft_validator_error(valid,8);
    }
    uVar8 = (uint)(ushort)(CONCAT11(FVar1,FVar3) >> 1);
    if ((((uVar7 < uVar8) || (uVar8 << 1 < uVar7)) ||
        (uVar8 + (ushort)(CONCAT11(FVar4,FVar5) >> 1) != uVar7)) || (uVar8 != 1 << (bVar2 & 0x1f)))
    {
      ft_validator_error(valid,8);
    }
  }
  p_delta = table + 0xe;
  p_end = table + (ulong)uVar6 * 2 + 0x10;
  p_offset = p_end + (ulong)uVar6 * 2;
  pFVar11 = p_offset + (ulong)uVar6 * 2;
  if ((FT_VALIDATE_TIGHT < valid->level) &&
     (CONCAT11(p_delta[(uVar7 - 1) * 2],(p_delta + (uVar7 - 1) * 2)[1]) != -1)) {
    ft_validator_error(valid,8);
  }
  delta = 0;
  p_start._4_4_ = 0;
  _idx = pFVar11;
  for (last_end = 0; last_end < uVar7; last_end = last_end + 1) {
    uVar8 = (uint)CONCAT11(*p_end,p_end[1]);
    uVar9 = (uint)CONCAT11(*p_delta,p_delta[1]);
    FVar1 = *p_offset;
    FVar3 = p_offset[1];
    uVar10 = (uint)CONCAT11(*_idx,_idx[1]);
    if (uVar9 < uVar8) {
      ft_validator_error(valid,8);
    }
    if ((uVar8 <= p_start._4_4_) && (last_end != 0)) {
      if (valid->level == FT_VALIDATE_DEFAULT) {
        if ((uVar8 < (uint)delta) || (uVar9 < p_start._4_4_)) {
          entry_selector = entry_selector | 1;
        }
        else {
          entry_selector = entry_selector | 2;
        }
      }
      else {
        ft_validator_error(valid,8);
      }
    }
    if ((uVar10 == 0) || (uVar10 == 0xffff)) {
      if ((uVar10 == 0xffff) &&
         ((((FT_VALIDATE_TIGHT < valid->level || (last_end != uVar7 - 1)) || (uVar8 != 0xffff)) ||
          (uVar9 != 0xffff)))) {
        ft_validator_error(valid,8);
      }
    }
    else {
      pFStack_20 = _idx + uVar10;
      if (valid->level == FT_VALIDATE_DEFAULT) {
        if ((((last_end != uVar7 - 1) || (uVar8 != 0xffff)) || (uVar9 != 0xffff)) &&
           ((pFStack_20 < pFVar11 + (ulong)uVar6 * 2 ||
            (valid->limit < pFStack_20 + ((uVar9 - uVar8) + 1) * 2)))) {
          ft_validator_error(valid,8);
        }
      }
      else if ((pFStack_20 < pFVar11 + (ulong)uVar6 * 2) ||
              (table + ends._4_4_ < pFStack_20 + ((uVar9 - uVar8) + 1) * 2)) {
        ft_validator_error(valid,8);
      }
      local_a4 = uVar8;
      if (valid->level != FT_VALIDATE_DEFAULT) {
        for (; local_a4 < uVar9; local_a4 = local_a4 + 1) {
          if ((CONCAT11(*pFStack_20,pFStack_20[1]) != 0) &&
             ((uint)valid[1].jump_buffer[0].__jmpbuf[0] <=
              (uint)(ushort)(CONCAT11(*pFStack_20,pFStack_20[1]) + CONCAT11(FVar1,FVar3)))) {
            ft_validator_error(valid,0x10);
          }
          pFStack_20 = pFStack_20 + 2;
        }
      }
    }
    _idx = _idx + 2;
    p_offset = p_offset + 2;
    p_delta = p_delta + 2;
    p_end = p_end + 2;
    p_start._4_4_ = uVar9;
    delta = uVar8;
  }
  return entry_selector;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap4_validate( FT_Byte*      table,
                     FT_Validator  valid )
  {
    FT_Byte*  p;
    FT_UInt   length;

    FT_Byte   *ends, *starts, *offsets, *deltas, *glyph_ids;
    FT_UInt   num_segs;
    FT_Error  error = FT_Err_Ok;


    if ( table + 2 + 2 > valid->limit )
      FT_INVALID_TOO_SHORT;

    p      = table + 2;           /* skip format */
    length = TT_NEXT_USHORT( p );

    /* in certain fonts, the `length' field is invalid and goes */
    /* out of bound.  We try to correct this here...            */
    if ( table + length > valid->limit )
    {
      if ( valid->level >= FT_VALIDATE_TIGHT )
        FT_INVALID_TOO_SHORT;

      length = (FT_UInt)( valid->limit - table );
    }

    if ( length < 16 )
      FT_INVALID_TOO_SHORT;

    p        = table + 6;
    num_segs = TT_NEXT_USHORT( p );   /* read segCountX2 */

    if ( valid->level >= FT_VALIDATE_PARANOID )
    {
      /* check that we have an even value here */
      if ( num_segs & 1 )
        FT_INVALID_DATA;
    }

    num_segs /= 2;

    if ( length < 16 + num_segs * 2 * 4 )
      FT_INVALID_TOO_SHORT;

    /* check the search parameters - even though we never use them */
    /*                                                             */
    if ( valid->level >= FT_VALIDATE_PARANOID )
    {
      /* check the values of `searchRange', `entrySelector', `rangeShift' */
      FT_UInt  search_range   = TT_NEXT_USHORT( p );
      FT_UInt  entry_selector = TT_NEXT_USHORT( p );
      FT_UInt  range_shift    = TT_NEXT_USHORT( p );


      if ( ( search_range | range_shift ) & 1 )  /* must be even values */
        FT_INVALID_DATA;

      search_range /= 2;
      range_shift  /= 2;

      /* `search range' is the greatest power of 2 that is <= num_segs */

      if ( search_range                > num_segs                 ||
           search_range * 2            < num_segs                 ||
           search_range + range_shift != num_segs                 ||
           search_range               != ( 1U << entry_selector ) )
        FT_INVALID_DATA;
    }

    ends      = table   + 14;
    starts    = table   + 16 + num_segs * 2;
    deltas    = starts  + num_segs * 2;
    offsets   = deltas  + num_segs * 2;
    glyph_ids = offsets + num_segs * 2;

    /* check last segment; its end count value must be 0xFFFF */
    if ( valid->level >= FT_VALIDATE_PARANOID )
    {
      p = ends + ( num_segs - 1 ) * 2;
      if ( TT_PEEK_USHORT( p ) != 0xFFFFU )
        FT_INVALID_DATA;
    }

    {
      FT_UInt   start, end, offset, n;
      FT_UInt   last_start = 0, last_end = 0;
      FT_Int    delta;
      FT_Byte*  p_start   = starts;
      FT_Byte*  p_end     = ends;
      FT_Byte*  p_delta   = deltas;
      FT_Byte*  p_offset  = offsets;


      for ( n = 0; n < num_segs; n++ )
      {
        p      = p_offset;
        start  = TT_NEXT_USHORT( p_start );
        end    = TT_NEXT_USHORT( p_end );
        delta  = TT_NEXT_SHORT( p_delta );
        offset = TT_NEXT_USHORT( p_offset );

        if ( start > end )
          FT_INVALID_DATA;

        /* this test should be performed at default validation level; */
        /* unfortunately, some popular Asian fonts have overlapping   */
        /* ranges in their charmaps                                   */
        /*                                                            */
        if ( start <= last_end && n > 0 )
        {
          if ( valid->level >= FT_VALIDATE_TIGHT )
            FT_INVALID_DATA;
          else
          {
            /* allow overlapping segments, provided their start points */
            /* and end points, respectively, are in ascending order    */
            /*                                                         */
            if ( last_start > start || last_end > end )
              error |= TT_CMAP_FLAG_UNSORTED;
            else
              error |= TT_CMAP_FLAG_OVERLAPPING;
          }
        }

        if ( offset && offset != 0xFFFFU )
        {
          p += offset;  /* start of glyph ID array */

          /* check that we point within the glyph IDs table only */
          if ( valid->level >= FT_VALIDATE_TIGHT )
          {
            if ( p < glyph_ids                                ||
                 p + ( end - start + 1 ) * 2 > table + length )
              FT_INVALID_DATA;
          }
          /* Some fonts handle the last segment incorrectly.  In */
          /* theory, 0xFFFF might point to an ordinary glyph --  */
          /* a cmap 4 is versatile and could be used for any     */
          /* encoding, not only Unicode.  However, reality shows */
          /* that far too many fonts are sloppy and incorrectly  */
          /* set all fields but `start' and `end' for the last   */
          /* segment if it contains only a single character.     */
          /*                                                     */
          /* We thus omit the test here, delaying it to the      */
          /* routines that actually access the cmap.             */
          else if ( n != num_segs - 1                       ||
                    !( start == 0xFFFFU && end == 0xFFFFU ) )
          {
            if ( p < glyph_ids                              ||
                 p + ( end - start + 1 ) * 2 > valid->limit )
              FT_INVALID_DATA;
          }

          /* check glyph indices within the segment range */
          if ( valid->level >= FT_VALIDATE_TIGHT )
          {
            FT_UInt  i, idx;


            for ( i = start; i < end; i++ )
            {
              idx = FT_NEXT_USHORT( p );
              if ( idx != 0 )
              {
                idx = (FT_UInt)( (FT_Int)idx + delta ) & 0xFFFFU;

                if ( idx >= TT_VALID_GLYPH_COUNT( valid ) )
                  FT_INVALID_GLYPH_ID;
              }
            }
          }
        }
        else if ( offset == 0xFFFFU )
        {
          /* some fonts (erroneously?) use a range offset of 0xFFFF */
          /* to mean missing glyph in cmap table                    */
          /*                                                        */
          if ( valid->level >= FT_VALIDATE_PARANOID    ||
               n != num_segs - 1                       ||
               !( start == 0xFFFFU && end == 0xFFFFU ) )
            FT_INVALID_DATA;
        }

        last_start = start;
        last_end   = end;
      }
    }

    return error;
  }